

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  XmlUnitTestResultPrinter *this_00;
  char *local_40;
  String local_30;
  
  UnitTestOptions::GetOutputFormat();
  bVar1 = String::operator==(&local_30,"xml");
  if (bVar1) {
    this_00 = (XmlUnitTestResultPrinter *)operator_new(0x18);
    UnitTestOptions::GetAbsolutePathToOutputFile();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_00,local_40);
    TestEventListeners::SetDefaultXmlGenerator(&this->listeners_,(TestEventListener *)this_00);
    if (local_40 != (char *)0x0) {
      operator_delete__(local_40);
    }
  }
  else {
    bVar1 = String::operator==(&local_30,"");
    if (!bVar1) {
      printf("WARNING: unrecognized output format \"%s\" ignored.\n",local_30.c_str_);
      fflush(_stdout);
    }
  }
  if (local_30.c_str_ != (char *)0x0) {
    operator_delete__(local_30.c_str_);
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const String& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format != "") {
    printf("WARNING: unrecognized output format \"%s\" ignored.\n",
           output_format.c_str());
    fflush(stdout);
  }
}